

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O0

Path * __thiscall
tinyusdz::Path::AppendProperty(Path *__return_storage_ptr__,Path *this,string *elem)

{
  Path local_f8;
  undefined1 local_21;
  string *local_20;
  string *elem_local;
  Path *this_local;
  Path *p;
  
  local_21 = 0;
  local_20 = elem;
  elem_local = &this->_prim_part;
  this_local = __return_storage_ptr__;
  Path(__return_storage_ptr__,this);
  append_property(&local_f8,__return_storage_ptr__,local_20);
  ~Path(&local_f8);
  return __return_storage_ptr__;
}

Assistant:

const Path Path::AppendProperty(const std::string &elem) const {
  Path p = (*this);  // copies

  p.append_property(elem);

  return p;
}